

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O2

bool __thiscall pm::Rectangle::shadowHit(Rectangle *this,Ray *ray,float *tMin)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if ((this->super_Geometry).castShadows_ != false) {
    fVar8 = (this->point_).x;
    fVar9 = (ray->o).x;
    fVar10 = (this->point_).y;
    fVar11 = (ray->o).y;
    fVar1 = (this->point_).z;
    fVar2 = (ray->o).z;
    fVar3 = (this->normal_).y;
    fVar4 = (this->normal_).x;
    fVar5 = (this->normal_).z;
    fVar7 = dot(&ray->d,&this->normal_);
    fVar7 = ((fVar1 - fVar2) * fVar5 + (fVar8 - fVar9) * fVar4 + (fVar10 - fVar11) * fVar3) / fVar7;
    if (fVar7 <= 1e-09) {
      bVar6 = false;
    }
    else {
      fVar9 = ((ray->d).x * fVar7 + (ray->o).x) - (this->point_).x;
      fVar10 = ((ray->d).y * fVar7 + (ray->o).y) - (this->point_).y;
      fVar8 = ((ray->d).z * fVar7 + (ray->o).z) - (this->point_).z;
      fVar11 = (this->a_).z * fVar8 + (this->a_).x * fVar9 + (this->a_).y * fVar10;
      bVar6 = false;
      if ((0.0 <= fVar11) &&
         (bVar6 = false, fVar11 < this->aSquaredLength_ || fVar11 == this->aSquaredLength_)) {
        fVar8 = fVar8 * (this->b_).z + fVar9 * (this->b_).x + fVar10 * (this->b_).y;
        bVar6 = false;
        if ((0.0 <= fVar8) && (fVar8 < this->bSquaredLength_ || fVar8 == this->bSquaredLength_)) {
          *tMin = fVar7;
          bVar6 = true;
        }
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool Rectangle::shadowHit(const Ray &ray, float &tMin) const
{
	if (castShadows_ == false)
		return false;

	float t = dot((point_ - ray.o), normal_) / dot(ray.d, normal_);

	if (t <= Epsilon)
		return false;

	Vector3 p = ray.o + t * ray.d;
	Vector3 d = p - point_;

	const float dDotA = dot(d, a_);
	if (dDotA < 0.0f || dDotA > aSquaredLength_)
		return false;

	const float dDotB = dot(d, b_);
	if (dDotB < 0.0f || dDotB > bSquaredLength_)
		return false;

	tMin = t;

	return true;
}